

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_422jpeg_420jpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  int in_ECX;
  int in_EDX;
  byte *in_RSI;
  long in_RDI;
  int x;
  int y;
  undefined1 local_1c8;
  int local_1c4;
  int local_1ac;
  undefined1 local_198;
  int local_194;
  int local_17c;
  int local_164;
  int local_14c;
  int local_138;
  int local_134;
  int local_11c;
  undefined1 local_108;
  undefined1 local_104;
  int local_100;
  undefined1 local_fc;
  int local_f8;
  int local_e8;
  int local_d8;
  undefined1 local_c4;
  int local_c0;
  int local_b0;
  int local_a0;
  int local_90;
  int local_80;
  int local_70;
  int local_5c;
  int local_58;
  int local_48;
  int local_38;
  int local_28;
  int local_20;
  int local_1c;
  byte *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
    local_1c = 0;
    while( true ) {
      local_28 = in_ECX;
      if (2 < in_ECX) {
        local_28 = 2;
      }
      if (local_28 <= local_1c) break;
      if (in_ECX + -1 < 1) {
        local_38 = in_ECX + -1;
      }
      else {
        local_38 = 1;
      }
      if (in_ECX + -1 < 2) {
        local_48 = in_ECX + -1;
      }
      else {
        local_48 = 2;
      }
      if (in_ECX + -1 < 3) {
        local_58 = in_ECX + -1;
      }
      else {
        local_58 = 3;
      }
      if ((int)((uint)*local_10 * 0x40 + (uint)local_10[local_38 * in_EDX] * 0x4e +
                (uint)local_10[local_48 * in_EDX] * -0x11 + (uint)local_10[local_58 * in_EDX] * 3 +
               0x40) >> 7 < 0x100) {
        if (in_ECX + -1 < 1) {
          local_70 = in_ECX + -1;
        }
        else {
          local_70 = 1;
        }
        if (in_ECX + -1 < 2) {
          local_80 = in_ECX + -1;
        }
        else {
          local_80 = 2;
        }
        if (in_ECX + -1 < 3) {
          local_90 = in_ECX + -1;
        }
        else {
          local_90 = 3;
        }
        local_5c = (int)((uint)*local_10 * 0x40 + (uint)local_10[local_70 * in_EDX] * 0x4e +
                         (uint)local_10[local_80 * in_EDX] * -0x11 +
                         (uint)local_10[local_90 * in_EDX] * 3 + 0x40) >> 7;
      }
      else {
        local_5c = 0xff;
      }
      if (local_5c < 1) {
        local_fc = 0;
      }
      else {
        if (in_ECX + -1 < 1) {
          local_a0 = in_ECX + -1;
        }
        else {
          local_a0 = 1;
        }
        if (in_ECX + -1 < 2) {
          local_b0 = in_ECX + -1;
        }
        else {
          local_b0 = 2;
        }
        if (in_ECX + -1 < 3) {
          local_c0 = in_ECX + -1;
        }
        else {
          local_c0 = 3;
        }
        if ((int)((uint)*local_10 * 0x40 + (uint)local_10[local_a0 * in_EDX] * 0x4e +
                  (uint)local_10[local_b0 * in_EDX] * -0x11 + (uint)local_10[local_c0 * in_EDX] * 3
                 + 0x40) >> 7 < 0x100) {
          if (in_ECX + -1 < 1) {
            local_d8 = in_ECX + -1;
          }
          else {
            local_d8 = 1;
          }
          if (in_ECX + -1 < 2) {
            local_e8 = in_ECX + -1;
          }
          else {
            local_e8 = 2;
          }
          if (in_ECX + -1 < 3) {
            local_f8 = in_ECX + -1;
          }
          else {
            local_f8 = 3;
          }
          local_c4 = (undefined1)
                     ((int)((uint)*local_10 * 0x40 + (uint)local_10[local_d8 * in_EDX] * 0x4e +
                            (uint)local_10[local_e8 * in_EDX] * -0x11 +
                            (uint)local_10[local_f8 * in_EDX] * 3 + 0x40) >> 7);
        }
        else {
          local_c4 = 0xff;
        }
        local_fc = local_c4;
      }
      *(undefined1 *)(local_8 + (local_1c >> 1) * in_EDX) = local_fc;
      local_1c = local_1c + 2;
    }
    for (; local_1c < in_ECX + -3; local_1c = local_1c + 2) {
      if ((int)(((uint)local_10[(local_1c + -2) * in_EDX] + (uint)local_10[(local_1c + 3) * in_EDX])
                * 3 + ((uint)local_10[(local_1c + -1) * in_EDX] +
                      (uint)local_10[(local_1c + 2) * in_EDX]) * -0x11 +
                ((uint)local_10[local_1c * in_EDX] + (uint)local_10[(local_1c + 1) * in_EDX]) * 0x4e
               + 0x40) >> 7 < 0x100) {
        local_100 = (int)(((uint)local_10[(local_1c + -2) * in_EDX] +
                          (uint)local_10[(local_1c + 3) * in_EDX]) * 3 +
                          ((uint)local_10[(local_1c + -1) * in_EDX] +
                          (uint)local_10[(local_1c + 2) * in_EDX]) * -0x11 +
                          ((uint)local_10[local_1c * in_EDX] +
                          (uint)local_10[(local_1c + 1) * in_EDX]) * 0x4e + 0x40) >> 7;
      }
      else {
        local_100 = 0xff;
      }
      if (local_100 < 1) {
        local_108 = 0;
      }
      else {
        if ((int)(((uint)local_10[(local_1c + -2) * in_EDX] +
                  (uint)local_10[(local_1c + 3) * in_EDX]) * 3 +
                  ((uint)local_10[(local_1c + -1) * in_EDX] +
                  (uint)local_10[(local_1c + 2) * in_EDX]) * -0x11 +
                  ((uint)local_10[local_1c * in_EDX] + (uint)local_10[(local_1c + 1) * in_EDX]) *
                  0x4e + 0x40) >> 7 < 0x100) {
          local_104 = (undefined1)
                      ((int)(((uint)local_10[(local_1c + -2) * in_EDX] +
                             (uint)local_10[(local_1c + 3) * in_EDX]) * 3 +
                             ((uint)local_10[(local_1c + -1) * in_EDX] +
                             (uint)local_10[(local_1c + 2) * in_EDX]) * -0x11 +
                             ((uint)local_10[local_1c * in_EDX] +
                             (uint)local_10[(local_1c + 1) * in_EDX]) * 0x4e + 0x40) >> 7);
        }
        else {
          local_104 = 0xff;
        }
        local_108 = local_104;
      }
      *(undefined1 *)(local_8 + (local_1c >> 1) * in_EDX) = local_108;
    }
    for (; local_1c < in_ECX; local_1c = local_1c + 2) {
      if (in_ECX + -1 < local_1c + 2) {
        local_11c = in_ECX + -1;
      }
      else {
        local_11c = local_1c + 2;
      }
      if (in_ECX + -1 < local_1c + 1) {
        local_134 = in_ECX + -1;
      }
      else {
        local_134 = local_1c + 1;
      }
      if ((int)(((uint)local_10[(local_1c + -2) * in_EDX] + (uint)local_10[(in_ECX + -1) * in_EDX])
                * 3 + ((uint)local_10[(local_1c + -1) * in_EDX] + (uint)local_10[local_11c * in_EDX]
                      ) * -0x11 +
                ((uint)local_10[local_1c * in_EDX] + (uint)local_10[local_134 * in_EDX]) * 0x4e +
               0x40) >> 7 < 0x100) {
        if (in_ECX + -1 < local_1c + 2) {
          local_14c = in_ECX + -1;
        }
        else {
          local_14c = local_1c + 2;
        }
        if (in_ECX + -1 < local_1c + 1) {
          local_164 = in_ECX + -1;
        }
        else {
          local_164 = local_1c + 1;
        }
        local_138 = (int)(((uint)local_10[(local_1c + -2) * in_EDX] +
                          (uint)local_10[(in_ECX + -1) * in_EDX]) * 3 +
                          ((uint)local_10[(local_1c + -1) * in_EDX] +
                          (uint)local_10[local_14c * in_EDX]) * -0x11 +
                          ((uint)local_10[local_1c * in_EDX] + (uint)local_10[local_164 * in_EDX]) *
                          0x4e + 0x40) >> 7;
      }
      else {
        local_138 = 0xff;
      }
      if (local_138 < 1) {
        local_1c8 = 0;
      }
      else {
        if (in_ECX + -1 < local_1c + 2) {
          local_17c = in_ECX + -1;
        }
        else {
          local_17c = local_1c + 2;
        }
        if (in_ECX + -1 < local_1c + 1) {
          local_194 = in_ECX + -1;
        }
        else {
          local_194 = local_1c + 1;
        }
        if ((int)(((uint)local_10[(local_1c + -2) * in_EDX] + (uint)local_10[(in_ECX + -1) * in_EDX]
                  ) * 3 + ((uint)local_10[(local_1c + -1) * in_EDX] +
                          (uint)local_10[local_17c * in_EDX]) * -0x11 +
                  ((uint)local_10[local_1c * in_EDX] + (uint)local_10[local_194 * in_EDX]) * 0x4e +
                 0x40) >> 7 < 0x100) {
          if (in_ECX + -1 < local_1c + 2) {
            local_1ac = in_ECX + -1;
          }
          else {
            local_1ac = local_1c + 2;
          }
          if (in_ECX + -1 < local_1c + 1) {
            local_1c4 = in_ECX + -1;
          }
          else {
            local_1c4 = local_1c + 1;
          }
          local_198 = (undefined1)
                      ((int)(((uint)local_10[(local_1c + -2) * in_EDX] +
                             (uint)local_10[(in_ECX + -1) * in_EDX]) * 3 +
                             ((uint)local_10[(local_1c + -1) * in_EDX] +
                             (uint)local_10[local_1ac * in_EDX]) * -0x11 +
                             ((uint)local_10[local_1c * in_EDX] + (uint)local_10[local_1c4 * in_EDX]
                             ) * 0x4e + 0x40) >> 7);
        }
        else {
          local_198 = 0xff;
        }
        local_1c8 = local_198;
      }
      *(undefined1 *)(local_8 + (local_1c >> 1) * in_EDX) = local_1c8;
    }
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
  }
  return;
}

Assistant:

static void y4m_422jpeg_420jpeg_helper(unsigned char *_dst,
                                       const unsigned char *_src, int _c_w,
                                       int _c_h) {
  int y;
  int x;
  /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
  for (x = 0; x < _c_w; x++) {
    for (y = 0; y < OC_MINI(_c_h, 2); y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (64 * _src[0] + 78 * _src[OC_MINI(1, _c_h - 1) * _c_w] -
                     17 * _src[OC_MINI(2, _c_h - 1) * _c_w] +
                     3 * _src[OC_MINI(3, _c_h - 1) * _c_w] + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h - 3; y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (3 * (_src[(y - 2) * _c_w] + _src[(y + 3) * _c_w]) -
                     17 * (_src[(y - 1) * _c_w] + _src[(y + 2) * _c_w]) +
                     78 * (_src[y * _c_w] + _src[(y + 1) * _c_w]) + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h; y += 2) {
      _dst[(y >> 1) * _c_w] = OC_CLAMPI(
          0,
          (3 * (_src[(y - 2) * _c_w] + _src[(_c_h - 1) * _c_w]) -
           17 * (_src[(y - 1) * _c_w] + _src[OC_MINI(y + 2, _c_h - 1) * _c_w]) +
           78 * (_src[y * _c_w] + _src[OC_MINI(y + 1, _c_h - 1) * _c_w]) +
           64) >>
              7,
          255);
    }
    _src++;
    _dst++;
  }
}